

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O1

size_t anon_unknown.dwarf_e01e40::countMaxConsecutiveEqualSigns(string *name)

{
  pointer pcVar1;
  char *pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  undefined1 local_1a;
  undefined1 local_19;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_19 = 0x3d;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar1,pcVar1 + name->_M_string_length);
  pcVar6 = (name->_M_dataplus)._M_p + name->_M_string_length;
  uVar8 = 0;
  if (_Var3._M_current != pcVar6) {
    do {
      pcVar4 = _Var3._M_current + 1;
      lVar5 = (long)pcVar6 - (long)pcVar4 >> 2;
      if (0 < lVar5) {
        pcVar4 = pcVar4 + ((long)pcVar6 - (long)pcVar4 & 0xfffffffffffffffc);
        lVar5 = lVar5 + 1;
        pcVar2 = _Var3._M_current;
        do {
          pcVar7 = pcVar2 + 4;
          if (pcVar2[1] != '=') {
            pcVar7 = pcVar2 + 1;
            goto LAB_0030af29;
          }
          if (pcVar2[2] != '=') {
            pcVar7 = pcVar2 + 2;
            goto LAB_0030af29;
          }
          if (pcVar2[3] != '=') {
            pcVar7 = pcVar2 + 3;
            goto LAB_0030af29;
          }
          if (*pcVar7 != '=') goto LAB_0030af29;
          lVar5 = lVar5 + -1;
          pcVar2 = pcVar7;
        } while (1 < lVar5);
      }
      lVar5 = (long)pcVar6 - (long)pcVar4;
      if (lVar5 == 1) {
LAB_0030af0e:
        pcVar7 = pcVar4;
        if (*pcVar4 == '=') {
          pcVar7 = pcVar6;
        }
      }
      else if (lVar5 == 2) {
LAB_0030af06:
        pcVar7 = pcVar4;
        if (*pcVar4 == '=') {
          pcVar4 = pcVar4 + 1;
          goto LAB_0030af0e;
        }
      }
      else {
        pcVar7 = pcVar6;
        if ((lVar5 == 3) && (pcVar7 = pcVar4, *pcVar4 == '=')) {
          pcVar4 = pcVar4 + 1;
          goto LAB_0030af06;
        }
      }
LAB_0030af29:
      if (uVar8 <= (ulong)((long)pcVar7 - (long)_Var3._M_current)) {
        uVar8 = (long)pcVar7 - (long)_Var3._M_current;
      }
      local_1a = 0x3d;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (pcVar7,pcVar6,&local_1a);
      pcVar6 = (name->_M_dataplus)._M_p + name->_M_string_length;
    } while (_Var3._M_current != pcVar6);
  }
  return uVar8;
}

Assistant:

std::size_t countMaxConsecutiveEqualSigns(const std::string& name)
{
  std::size_t max = 0;
  auto startIt = find(name.begin(), name.end(), '=');
  auto endIt = startIt;
  for (; startIt != name.end(); startIt = find(endIt, name.end(), '=')) {
    endIt =
      find_if_not(startIt + 1, name.end(), [](char c) { return c == '='; });
    max =
      std::max(max, static_cast<std::size_t>(std::distance(startIt, endIt)));
  }
  return max;
}